

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void google::protobuf::internal::SwapFieldHelper::SwapInlinedStrings<true>
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  bool donated;
  bool from_donated;
  uint32_t uVar1;
  Arena *arena;
  InlinedStringField *this;
  InlinedStringField *from;
  uint32_t *puVar2;
  uint32_t *puVar3;
  uint32 mask;
  uint32 *rhs_state;
  uint32 *lhs_state;
  uint32 index;
  InlinedStringField *rhs_string;
  InlinedStringField *lhs_string;
  Arena *rhs_arena;
  Arena *lhs_arena;
  FieldDescriptor *field_local;
  Message *rhs_local;
  Message *lhs_local;
  Reflection *r_local;
  
  arena = MessageLite::GetArenaForAllocation(&lhs->super_MessageLite);
  MessageLite::GetArenaForAllocation(&rhs->super_MessageLite);
  this = Reflection::MutableRaw<google::protobuf::internal::InlinedStringField>(r,lhs,field);
  from = Reflection::MutableRaw<google::protobuf::internal::InlinedStringField>(r,rhs,field);
  uVar1 = ReflectionSchema::InlinedStringIndex(&r->schema_,field);
  puVar2 = Reflection::MutableInlinedStringDonatedArray(r,lhs);
  puVar3 = Reflection::MutableInlinedStringDonatedArray(r,rhs);
  donated = Reflection::IsInlinedStringDonated(r,lhs,field);
  from_donated = Reflection::IsInlinedStringDonated(r,rhs,field);
  InlinedStringField::Swap
            (this,from,(string *)0x0,arena,donated,from_donated,puVar2 + (uVar1 >> 5),
             puVar3 + (uVar1 >> 5),1 << ((byte)uVar1 & 0x1f) ^ 0xffffffff);
  return;
}

Assistant:

void SwapFieldHelper::SwapInlinedStrings(const Reflection* r, Message* lhs,
                                         Message* rhs,
                                         const FieldDescriptor* field) {
  // Inlined string field.
  Arena* lhs_arena = lhs->GetArenaForAllocation();
  Arena* rhs_arena = rhs->GetArenaForAllocation();
  auto* lhs_string = r->MutableRaw<InlinedStringField>(lhs, field);
  auto* rhs_string = r->MutableRaw<InlinedStringField>(rhs, field);
  const uint32 index = r->schema_.InlinedStringIndex(field);
  uint32* lhs_state = &r->MutableInlinedStringDonatedArray(lhs)[index / 32];
  uint32* rhs_state = &r->MutableInlinedStringDonatedArray(rhs)[index / 32];
  const uint32 mask = ~(static_cast<uint32>(1) << (index % 32));
  if (unsafe_shallow_swap || lhs_arena == rhs_arena) {
    lhs_string->Swap(rhs_string, /*default_value=*/nullptr, lhs_arena,
                     r->IsInlinedStringDonated(*lhs, field),
                     r->IsInlinedStringDonated(*rhs, field),
                     /*donating_states=*/lhs_state, rhs_state, mask);
  } else {
    const std::string temp = lhs_string->Get();
    lhs_string->Set(nullptr, rhs_string->Get(), lhs_arena,
                    r->IsInlinedStringDonated(*lhs, field), lhs_state, mask);
    rhs_string->Set(nullptr, temp, rhs_arena,
                    r->IsInlinedStringDonated(*rhs, field), rhs_state, mask);
  }
}